

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall
mp::internal::SolverAppOptionParser::SolverAppOptionParser
          (SolverAppOptionParser *this,BasicSolver *s)

{
  BasicSolver *in_RSI;
  SolverAppOptionParser *in_RDI;
  Builder<mp::BasicSolver> options;
  Builder<mp::internal::SolverAppOptionParser> app_options;
  char name;
  SolverAppOptionParser *this_00;
  Builder<mp::BasicSolver> local_40;
  Builder<mp::internal::SolverAppOptionParser> local_30 [2];
  BasicSolver *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  this_00->solver_ = local_10;
  OptionList::OptionList((OptionList *)this_00);
  in_RDI->echo_solver_options_ = true;
  OptionList::Builder<mp::internal::SolverAppOptionParser>::Builder
            (local_30,&in_RDI->options_,in_RDI);
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::ShowUsage>
            ((Builder<mp::internal::SolverAppOptionParser> *)this_00,(char)((ulong)in_RDI >> 0x38),
             (char *)0x6e3f83);
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::EndOptions>
            ((Builder<mp::internal::SolverAppOptionParser> *)this_00,(char)((ulong)in_RDI >> 0x38),
             (char *)0x6e3f9b);
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  AddWithParam<&mp::internal::SolverAppOptionParser::ShowSolverOptions>
            ((Builder<mp::internal::SolverAppOptionParser> *)this_00,(char)((ulong)in_RDI >> 0x38),
             (char *)0x6e3fb3);
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::ShowSolverOptionsASL>
            ((Builder<mp::internal::SolverAppOptionParser> *)this_00,(char)((ulong)in_RDI >> 0x38),
             (char *)0x6e3fcb);
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::ShowSolveResults>
            ((Builder<mp::internal::SolverAppOptionParser> *)this_00,(char)((ulong)in_RDI >> 0x38),
             (char *)0x6e3fe3);
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::DontEchoSolverOptions>
            ((Builder<mp::internal::SolverAppOptionParser> *)this_00,(char)((ulong)in_RDI >> 0x38),
             (char *)0x6e3ffb);
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::WantSol>
            ((Builder<mp::internal::SolverAppOptionParser> *)this_00,(char)((ulong)in_RDI >> 0x38),
             (char *)0x6e4013);
  OptionList::Builder<mp::BasicSolver>::Builder(&local_40,&in_RDI->options_,local_10);
  name = (char)((ulong)in_RDI >> 0x38);
  OptionList::Builder<mp::BasicSolver>::Add<&mp::BasicSolver::ShowVersion>
            ((Builder<mp::BasicSolver> *)this_00,name,(char *)0x6e4044);
  OptionList::Builder<mp::BasicSolver>::Add<&mp::BasicSolver::ShowConstraintDescriptions>
            ((Builder<mp::BasicSolver> *)this_00,name,(char *)0x6e405c);
  return;
}

Assistant:

SolverAppOptionParser::SolverAppOptionParser(BasicSolver &s)
  : solver_(s), echo_solver_options_(true) {
  // Add standard command-line options.
  OptionList::Builder<SolverAppOptionParser> app_options(options_, *this);
  app_options.Add<&SolverAppOptionParser::ShowUsage>(
        '?', "show usage and exit");
  app_options.Add<&SolverAppOptionParser::EndOptions>('-', "end of options");
  app_options.AddWithParam<&SolverAppOptionParser::ShowSolverOptions>(
        '=', "show solver options and exit");
  app_options.Add<&SolverAppOptionParser::ShowSolverOptionsASL>(
    'a', "show solver options (ASL style, 1st synonyms if provided) and exit");
  app_options.Add<&SolverAppOptionParser::ShowSolveResults>(
    '!', "show solve result codes");
  app_options.Add<&SolverAppOptionParser::DontEchoSolverOptions>(
        'e', "suppress echoing of assignments");
  app_options.Add<&SolverAppOptionParser::WantSol>(
        's', "write .sol file (without -AMPL)");
  OptionList::Builder<mp::BasicSolver> options(options_, s);
  options.Add<&mp::BasicSolver::ShowVersion>('v', "show version and exit");
  options.Add<&mp::BasicSolver::ShowConstraintDescriptions>('c',
                                             "show constraint descriptions and exit");
  // TODO: if solver supports functions add options -ix and -u
  // "ix", "import user-defined functions from x; -i? gives details",
  // "u",  "just show available user-defined functions"
}